

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

float_specs
fmt::v8::detail::parse_float_type_spec<fmt::v8::detail::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  uint uVar1;
  error_handler *eh_local;
  basic_format_specs<char> *specs_local;
  float_specs result;
  
  uVar1 = (*(ushort *)&specs->field_0x9 & 0x80) << 0xd | ((byte)specs->field_0xa & 1) << 0x11;
  specs_local = (basic_format_specs<char> *)((ulong)uVar1 << 0x20);
  switch(specs->type) {
  case none:
    specs_local = (basic_format_specs<char> *)((ulong)uVar1 << 0x20);
    break;
  default:
    error_handler::on_error(eh,"invalid type specifier");
  case hexfloat_upper:
    specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
  case hexfloat_lower:
    specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x300000000);
    break;
  case exp_upper:
    specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
  case exp_lower:
    uVar1 = (uint)((ulong)specs_local >> 0x20);
    specs_local = (basic_format_specs<char> *)
                  ((ulong)(uVar1 & 0xffefffff | 1 |
                          (uint)(uVar1 >> 0x14 != 0 || specs->precision != 0) << 0x14) << 0x20);
    break;
  case fixed_upper:
    specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
  case fixed_lower:
    uVar1 = (uint)((ulong)specs_local >> 0x20);
    specs_local = (basic_format_specs<char> *)
                  ((ulong)(uVar1 & 0xffefffff | 2 |
                          (uint)(uVar1 >> 0x14 != 0 || specs->precision != 0) << 0x14) << 0x20);
    break;
  case general_upper:
    specs_local = (basic_format_specs<char> *)((ulong)specs_local | 0x1000000000000);
  case general_lower:
  }
  return (float_specs)specs_local;
}

Assistant:

FMT_CONSTEXPR auto parse_float_type_spec(const basic_format_specs<Char>& specs,
                                         ErrorHandler&& eh = {})
    -> float_specs {
  auto result = float_specs();
  result.showpoint = specs.alt;
  result.locale = specs.localized;
  switch (specs.type) {
  case presentation_type::none:
    result.format = float_format::general;
    break;
  case presentation_type::general_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::general_lower:
    result.format = float_format::general;
    break;
  case presentation_type::exp_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::exp_lower:
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::fixed_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::fixed_lower:
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::hexfloat_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::hexfloat_lower:
    result.format = float_format::hex;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}